

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void Cmd_weapprev(FCommandLine *argv,APlayerPawn *who,int key)

{
  FFont *font;
  DBaseStatusBar *this;
  uint uVar1;
  EColorRange textColor;
  DHUDMessageFadeOut *this_00;
  char *text;
  player_t *player;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  player = (player_t *)(&players + (long)consoleplayer * 0x54);
  SendItemUse = (AInventory *)
                FWeaponSlots::PickPrevWeapon
                          ((FWeaponSlots *)((long)consoleplayer * 0x2a0 + 0x1ae72a0),player);
  uVar1 = FIntCVar::operator_cast_to_int(&displaynametags);
  this = StatusBar;
  if (((((uVar1 & 2) != 0) && (StatusBar != (DBaseStatusBar *)0x0)) && (SmallFont != (FFont *)0x0))
     && (SendItemUse != (AInventory *)0x0)) {
    this_00 = (DHUDMessageFadeOut *)DObject::operator_new((DObject *)0xc8,(size_t)player);
    font = SmallFont;
    text = AActor::GetTag(&SendItemUse->super_AActor,(char *)0x0);
    textColor = FIntCVar::operator*(&nametagcolor);
    DHUDMessageFadeOut::DHUDMessageFadeOut(this_00,font,text,1.5,0.9,0,0,textColor,2.0,0.35);
    DBaseStatusBar::AttachMessage(this,(DHUDMessage *)this_00,0x4e504557,0);
  }
  return;
}

Assistant:

CCMD (weapprev)
{
	SendItemUse = players[consoleplayer].weapons.PickPrevWeapon (&players[consoleplayer]);
	// [BC] Option to display the name of the weapon being cycled to.
	if ((displaynametags & 2) && StatusBar && SmallFont && SendItemUse)
	{
		StatusBar->AttachMessage(new DHUDMessageFadeOut(SmallFont, SendItemUse->GetTag(),
			1.5f, 0.90f, 0, 0, (EColorRange)*nametagcolor, 2.f, 0.35f), MAKE_ID( 'W', 'E', 'P', 'N' ));
	}
}